

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O2

void bench_hmac_sha256(void *arg,int iters)

{
  size_t in_RDX;
  size_t extraout_RDX;
  uchar *key;
  int iVar1;
  bool bVar2;
  secp256k1_hmac_sha256 hmac;
  
  key = (uchar *)((long)arg + 0x290);
  iVar1 = 0;
  if (0 < iters) {
    iVar1 = iters;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_hmac_sha256_initialize(&hmac,key,in_RDX);
    secp256k1_sha256_write(&hmac.inner,key,0x20);
    secp256k1_hmac_sha256_finalize(&hmac,key);
    in_RDX = extraout_RDX;
  }
  return;
}

Assistant:

static void bench_hmac_sha256(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_hmac_sha256 hmac;

    for (i = 0; i < iters; i++) {
        secp256k1_hmac_sha256_initialize(&hmac, data->data, 32);
        secp256k1_hmac_sha256_write(&hmac, data->data, 32);
        secp256k1_hmac_sha256_finalize(&hmac, data->data);
    }
}